

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86_fma::create_pipeline(InnerProduct_x86_fma *this,Option *opt)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int iVar4;
  Layer *pLVar5;
  undefined8 *puVar6;
  byte *in_RSI;
  long *in_RDI;
  int j;
  int p;
  float *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int num_input;
  ParamDict pd;
  ParamDict *in_stack_fffffffffffffe60;
  long *plVar7;
  undefined8 in_stack_fffffffffffffe68;
  long *plVar8;
  Option *in_stack_fffffffffffffe70;
  void **ppvVar9;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  ParamDict *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Mat *this_00;
  int local_164;
  int local_150;
  int local_14c;
  undefined4 *local_148;
  int local_13c;
  void *local_138;
  int *local_130;
  Allocator *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  int local_10c;
  Option *in_stack_ffffffffffffff00;
  InnerProduct_x86_fma *in_stack_ffffffffffffff08;
  int local_ec;
  undefined1 local_d8 [16];
  byte *local_c8;
  int local_b4;
  void **local_b0;
  int local_9c;
  void **local_98;
  int local_8c;
  long *local_88;
  int local_80;
  undefined4 local_7c;
  long *local_78;
  long *local_70;
  long *local_68;
  int local_60;
  undefined4 local_5c;
  long *local_58;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  int local_30;
  undefined4 local_2c;
  undefined8 *local_28;
  void *local_20;
  void *local_8;
  
  local_c8 = in_RSI;
  pLVar5 = create_layer((int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  in_RDI[1] = (long)pLVar5;
  ParamDict::ParamDict(in_stack_fffffffffffffe80);
  (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_d8);
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_c8);
  ParamDict::~ParamDict(in_stack_fffffffffffffe60);
  if (((local_c8[0x1e] & 1) == 0) ||
     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140) != 1)) {
    iVar4 = cpu_support_x86_f16c();
    if ((iVar4 == 0) || ((local_c8[0x22] & 1) == 0)) {
      iVar4 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      iVar1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_ec = 1;
      if ((local_c8[0x27] & 1) != 0) {
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
          local_164 = 8;
        }
        else {
          local_164 = 1;
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
            local_164 = 4;
          }
        }
        local_ec = local_164;
      }
      if (local_ec == 1) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        local_78 = (long *)((long)in_RDI + lVar2 + 0x130);
        plVar7 = in_RDI + 2;
        local_70 = plVar7;
        local_68 = plVar7;
        if (plVar7 != local_78) {
          if (*(long *)((long)in_RDI + lVar2 + 0x138) != 0) {
            piVar3 = *(int **)((long)in_RDI + lVar2 + 0x138);
            local_7c = 1;
            LOCK();
            local_80 = *piVar3;
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          plVar8 = plVar7;
          local_58 = plVar7;
          if (in_RDI[3] != 0) {
            piVar3 = (int *)in_RDI[3];
            local_5c = 0xffffffff;
            LOCK();
            local_60 = *piVar3;
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (local_60 == 1) {
              if (in_RDI[6] == 0) {
                local_8 = (void *)*plVar7;
                if (local_8 != (void *)0x0) {
                  free(local_8);
                }
              }
              else {
                (**(code **)(*(long *)in_RDI[6] + 0x18))((long *)in_RDI[6],*plVar7);
              }
            }
          }
          *plVar7 = 0;
          plVar7[2] = 0;
          *(undefined4 *)(plVar7 + 3) = 0;
          *(undefined4 *)(plVar7 + 5) = 0;
          *(undefined4 *)((long)plVar7 + 0x2c) = 0;
          *(undefined4 *)(plVar7 + 6) = 0;
          *(undefined4 *)((long)plVar7 + 0x34) = 0;
          *(undefined4 *)(plVar7 + 7) = 0;
          plVar7[8] = 0;
          plVar7[1] = 0;
          *plVar8 = *local_78;
          plVar8[1] = local_78[1];
          plVar8[2] = local_78[2];
          *(int *)(plVar8 + 3) = (int)local_78[3];
          plVar8[4] = local_78[4];
          *(int *)(plVar8 + 5) = (int)local_78[5];
          *(undefined4 *)((long)plVar8 + 0x2c) = *(undefined4 *)((long)local_78 + 0x2c);
          *(int *)(plVar8 + 6) = (int)local_78[6];
          *(undefined4 *)((long)plVar8 + 0x34) = *(undefined4 *)((long)local_78 + 0x34);
          *(int *)(plVar8 + 7) = (int)local_78[7];
          plVar8[8] = local_78[8];
          local_68 = plVar8;
        }
      }
      else {
        this_00 = (Mat *)0x0;
        Mat::reshape(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffed8);
        Mat::create(this_00,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                    (int)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80,
                    in_stack_fffffffffffffe7c,(Allocator *)in_stack_fffffffffffffe70);
        for (local_13c = 0;
            local_13c + local_ec + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_13c = local_ec + local_13c) {
          local_88 = in_RDI + 2;
          local_8c = local_13c / local_ec;
          local_148 = (undefined4 *)
                      (*local_88 + (long)*(int *)((long)in_RDI + 0x3c) * (long)local_8c * in_RDI[4])
          ;
          for (local_14c = 0; local_14c < iVar4 / iVar1; local_14c = local_14c + 1) {
            for (local_150 = 0; local_150 < local_ec; local_150 = local_150 + 1) {
              local_9c = local_13c + local_150;
              local_98 = &local_138;
              *local_148 = *(undefined4 *)
                            ((long)local_138 +
                            (long)local_14c * 4 +
                            (long)local_10c * (long)local_9c * (long)in_stack_fffffffffffffed8);
              local_148 = local_148 + 1;
            }
          }
        }
        ppvVar9 = &local_138;
        local_b0 = ppvVar9;
        local_38 = ppvVar9;
        if (local_130 != (int *)0x0) {
          local_3c = 0xffffffff;
          LOCK();
          local_40 = *local_130;
          *local_130 = *local_130 + -1;
          UNLOCK();
          if (local_40 == 1) {
            if (in_stack_fffffffffffffee8 == (Mat *)0x0) {
              if (local_138 != (void *)0x0) {
                free(local_138);
              }
            }
            else {
              (**(code **)((long)in_stack_fffffffffffffee8->data + 0x18))
                        (in_stack_fffffffffffffee8,local_138);
            }
          }
        }
        *ppvVar9 = (void *)0x0;
        ppvVar9[2] = (void *)0x0;
        *(undefined4 *)(ppvVar9 + 3) = 0;
        *(undefined4 *)(ppvVar9 + 5) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x2c) = 0;
        *(undefined4 *)(ppvVar9 + 6) = 0;
        *(undefined4 *)((long)ppvVar9 + 0x34) = 0;
        *(undefined4 *)(ppvVar9 + 7) = 0;
        ppvVar9[8] = (void *)0x0;
        ppvVar9[1] = (void *)0x0;
      }
      if ((*local_c8 & 1) != 0) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        puVar6 = (undefined8 *)((long)in_RDI + lVar2 + 0x130);
        if (*(long *)((long)in_RDI + lVar2 + 0x138) != 0) {
          piVar3 = *(int **)((long)in_RDI + lVar2 + 0x138);
          local_2c = 0xffffffff;
          LOCK();
          local_30 = *piVar3;
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (local_30 == 1) {
            local_28 = puVar6;
            if (*(long *)((long)in_RDI + lVar2 + 0x150) == 0) {
              local_20 = (void *)*puVar6;
              if (local_20 != (void *)0x0) {
                free(local_20);
              }
            }
            else {
              plVar7 = *(long **)((long)in_RDI + lVar2 + 0x150);
              (**(code **)(*plVar7 + 0x18))(plVar7,*puVar6);
            }
          }
        }
        *puVar6 = 0;
        *(undefined8 *)((long)in_RDI + lVar2 + 0x140) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x148) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x158) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x15c) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x160) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x164) = 0;
        *(undefined4 *)((long)in_RDI + lVar2 + 0x168) = 0;
        *(undefined8 *)((long)in_RDI + lVar2 + 0x170) = 0;
        *(undefined8 *)((long)in_RDI + lVar2 + 0x138) = 0;
      }
      local_b4 = 0;
    }
    else {
      local_b4 = create_pipeline_fp16s
                           ((InnerProduct_x86_fma *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            in_stack_fffffffffffffe70);
    }
  }
  else {
    local_b4 = create_pipeline_int8_x86(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  }
  return local_b4;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_tm.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_tm.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }
    else
    {
        weight_data_tm = weight_data;
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}